

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O2

void __thiscall
BCL::
Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
::set(Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
      *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,uint64_t rank)

{
  size_t sVar1;
  runtime_error *this_00;
  size_t in_R8;
  GlobalPtr<char> GVar2;
  GlobalPtr<char> dst;
  undefined8 uStack_38;
  serial_ptr<char> ptr;
  
  sVar1 = (this->ptr).rank;
  if ((sVar1 != 0 || (this->ptr).ptr != 0) && (sVar1 == my_rank)) {
    GVar2.ptr = (size_t)ptr.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    GVar2.rank = uStack_38;
    dealloc<char>(GVar2);
  }
  serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
  ::operator()(&ptr,(serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
                     *)((long)&uStack_38 + 7),val);
  GVar2 = local_malloc<char>(ptr.N);
  dst.rank = GVar2.ptr;
  this->ptr = GVar2;
  if ((char *)GVar2.rank != (char *)0x0 || dst.rank != 0) {
    this->len = ptr.N;
    dst.ptr = ptr.N;
    write<char>((BCL *)ptr.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                (char *)GVar2.rank,dst,in_R8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ptr.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"BCL Container: ran out of memory");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set(const T &val, uint64_t rank = BCL::rank()) {
      // TODO: memory leak.
      if (this->ptr != nullptr && this->ptr.is_local()) {
        BCL::dealloc(this->ptr);
      }
      serial_ptr <SPT> ptr = Serialize{}(val);
      this->ptr = BCL::alloc <SPT> (ptr.N);
      if (this->ptr == nullptr) {
        throw std::runtime_error("BCL Container: ran out of memory");
      }
      this->len = ptr.N;
      BCL::rput(ptr.ptr.get(), this->ptr, ptr.N);
    }